

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O1

SquareMatrix<std::complex<float>_> * __thiscall
qclab::dense::SquareMatrix<std::complex<float>_>::operator*=
          (SquareMatrix<std::complex<float>_> *this,SquareMatrix<std::complex<float>_> *rhs)

{
  float fVar1;
  _ComplexT _Var2;
  complex<float> *pcVar3;
  complex<float> *__s;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong __n;
  long lVar8;
  long lVar9;
  float fVar10;
  undefined8 uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  lVar7 = this->size_;
  if (lVar7 != rhs->size_) {
    __assert_fail("size_ == rhs.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/dense/SquareMatrix.hpp"
                  ,0xb0,
                  "SquareMatrix<T> &qclab::dense::SquareMatrix<std::complex<float>>::operator*=(const SquareMatrix<T> &) [T = std::complex<float>]"
                 );
  }
  if (lVar7 == 0) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O1/_deps/qclabpp-src/include/qclab/dense/memory.hpp"
                  ,0x1e,
                  "auto qclab::dense::init_unique_array(const int64_t) [T = std::complex<float>]");
  }
  __n = lVar7 * lVar7 * 8;
  __s = (complex<float> *)operator_new__(-(ulong)((ulong)(lVar7 * lVar7) >> 0x3d != 0) | __n);
  memset(__s,0,__n);
  if (0 < this->size_) {
    lVar7 = 0;
    lVar9 = 0;
    do {
      if (0 < this->size_) {
        lVar6 = 0;
        do {
          lVar4 = this->size_;
          if (0 < lVar4) {
            lVar8 = 0;
            do {
              lVar5 = rhs->size_ * lVar7;
              pcVar3 = (rhs->data_)._M_t.
                       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                       .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
              _Var2 = (this->data_)._M_t.
                      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                      .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl
                      [lVar4 * lVar8 + lVar6]._M_value;
              fVar14 = *(float *)((long)&pcVar3[lVar8]._M_value + lVar5);
              fVar1 = *(float *)((long)&pcVar3[lVar8]._M_value + lVar5 + 4);
              fVar12 = (float)_Var2;
              fVar13 = (float)(_Var2 >> 0x20);
              fVar10 = fVar14 * fVar12 - fVar13 * fVar1;
              fVar14 = fVar14 * fVar13 + fVar12 * fVar1;
              uVar11 = CONCAT44(fVar14,fVar10);
              if ((NAN(fVar10)) && (uVar11 = CONCAT44(fVar14,fVar10), NAN(fVar14))) {
                uVar11 = __mulsc3(fVar12);
              }
              lVar4 = this->size_ * lVar9;
              fVar14 = *(float *)((long)&__s[lVar6 + lVar4]._M_value + 4);
              *(float *)&__s[lVar6 + lVar4]._M_value =
                   (float)uVar11 + *(float *)&__s[lVar6 + lVar4]._M_value;
              *(float *)((long)&__s[lVar6 + lVar4]._M_value + 4) =
                   (float)((ulong)uVar11 >> 0x20) + fVar14;
              lVar8 = lVar8 + 1;
              lVar4 = this->size_;
            } while (lVar8 < lVar4);
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < this->size_);
      }
      lVar9 = lVar9 + 1;
      lVar7 = lVar7 + 8;
    } while (lVar9 < this->size_);
  }
  pcVar3 = (this->data_)._M_t.
           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
           _M_t.
           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
           .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  (this->data_)._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl = __s;
  if (pcVar3 != (complex<float> *)0x0) {
    operator_delete__(pcVar3);
  }
  return this;
}

Assistant:

inline SquareMatrix< T >& operator*=( const SquareMatrix< T >& rhs ) {
          assert( size_ == rhs.size() ) ;
          auto new_data = init_unique_array< T >( size_ * size_ ) ;
          #pragma omp parallel for
          for ( int64_t j = 0; j < size_; j++ ) {
            for ( int64_t i = 0; i < size_; i++ ) {
              for ( int64_t k = 0; k < size_; k++ ) {
                new_data.get()[ i + j*size_ ] += (*this)(i,k) * rhs(k,j) ;
              }
            }
          }
          data_ = std::move( new_data ) ;
          return *this ;
        }